

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::DBTest_ApproximateSizes_Test::TestBody(DBTest_ApproximateSizes_Test *this)

{
  ulong *puVar1;
  DB *pDVar2;
  undefined8 uVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  undefined8 *puVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int i;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int i_00;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int i_01;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var14;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_08;
  long *extraout_RDX_09;
  long extraout_RDX_10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long extraout_RDX_11;
  long extraout_RDX_12;
  long extraout_RDX_13;
  long lVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_14;
  long extraout_RDX_15;
  int iVar17;
  long *plVar18;
  char *pcVar19;
  char *in_R9;
  ulong uVar20;
  long *plVar21;
  leveldb *plVar22;
  bool bVar23;
  bool bVar24;
  AssertionResult AVar25;
  AssertionResult gtest_ar;
  string r;
  uint64_t size_2;
  uint64_t size;
  AssertionResult gtest_ar_1;
  Random rnd;
  Options options;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string local_138;
  Slice local_118;
  undefined1 local_101;
  string local_100;
  int local_dc;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_d8;
  undefined7 uStack_d7;
  undefined8 *local_d0;
  ulong local_c8;
  Random local_bc;
  ulong local_b8;
  void *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  undefined8 *puStack_a0;
  Options local_90;
  
  do {
    DBTest::CurrentOptions(&local_90,&this->super_DBTest);
    local_90.write_buffer_size = 100000000;
    local_90.compression = kNoCompression;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
    local_158._0_8_ = "";
    local_158._8_8_ = (undefined8 *)0x0;
    local_148._M_allocated_capacity = 0x17bad5;
    local_148._8_8_ = (undefined8 *)0x3;
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[10])(pDVar2,(string *)local_158,1,&local_100);
    _Var5._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_100._M_dataplus._M_p,0,0);
      local_138._M_dataplus._M_p._0_1_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var5._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_138._M_string_length = 0;
      testing::Message::Message((Message *)&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_158,(internal *)&local_138,
                 (AssertionResult *)"Between(Size(\"\", \"xyz\"), 0, 0)","false","true",in_R9);
      iVar7 = 0x49e;
LAB_00120e83:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,iVar7,(char *)local_158._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._0_8_ != &local_148) {
        operator_delete((void *)local_158._0_8_);
      }
      puVar13 = (undefined8 *)local_138._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_100._M_dataplus._M_p + 8))();
        puVar13 = (undefined8 *)local_138._M_string_length;
      }
LAB_00120d4c:
      if (puVar13 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar13 != puVar13 + 2) {
          operator_delete((undefined8 *)*puVar13);
        }
        operator_delete(puVar13);
      }
      return;
    }
    DBTest::Reopen(&this->super_DBTest,&local_90);
    local_158._0_8_ = "";
    local_158._8_8_ = (undefined8 *)0x0;
    local_148._M_allocated_capacity = 0x17bad5;
    local_148._8_8_ = (undefined8 *)0x3;
    pDVar2 = (this->super_DBTest).db_;
    (*pDVar2->_vptr_DB[10])(pDVar2,(string *)local_158,1,&local_100);
    _Var5._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_100._M_dataplus._M_p,0,0);
      local_138._M_dataplus._M_p._0_1_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var5._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_138._M_string_length = 0;
      testing::Message::Message((Message *)&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_158,(internal *)&local_138,
                 (AssertionResult *)"Between(Size(\"\", \"xyz\"), 0, 0)","false","true",in_R9);
      iVar7 = 0x4a0;
      goto LAB_00120e83;
    }
    iVar7 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
    local_138._M_dataplus._M_p._0_4_ = iVar7;
    local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffff00000000;
    AVar25 = testing::internal::CmpHelperEQ<int,int>
                       ((internal *)local_158,"NumTableFilesAtLevel(0)","0",(int *)&local_138,
                        (int *)&local_100);
    uVar3 = local_158._8_8_;
    _Var14._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar25.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_158[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_138);
      if ((undefined8 *)local_158._8_8_ == (undefined8 *)0x0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)local_158._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x4a3,pcVar19);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      puVar13 = (undefined8 *)local_158._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
        puVar13 = (undefined8 *)local_158._8_8_;
      }
      goto LAB_00120d4c;
    }
    if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_158._8_8_);
      }
      operator_delete((void *)uVar3);
      _Var14 = extraout_RDX.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    }
    local_bc.seed_ = 0x12d;
    bVar23 = false;
    plVar22 = (leveldb *)0x0;
    do {
      Key_abi_cxx11_((string *)local_158,plVar22,(int)_Var14._M_head_impl);
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity =
           local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      test::RandomString(&local_bc,100000,&local_138);
      pDVar2 = (this->super_DBTest).db_;
      local_101 = 0;
      local_100._M_dataplus._M_p = (pointer)local_158._0_8_;
      local_100._M_string_length = local_158._8_8_;
      local_118.data_ = local_138._M_dataplus._M_p;
      local_118.size_ = local_138._M_string_length;
      (*pDVar2->_vptr_DB[2])(&local_b0,pDVar2,&local_101,&local_100);
      AVar25 = testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
               operator()(&local_d8,(char *)&local_100,
                          (Status *)"Put(Key(i), RandomString(&rnd, S1))");
      _Var14._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar25.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      if (local_b0 != (void *)0x0) {
        operator_delete__(local_b0);
        _Var14._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             extraout_RDX_00._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
        _Var14._M_head_impl = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._0_8_ != &local_148) {
        operator_delete((void *)local_158._0_8_);
        _Var14._M_head_impl = extraout_RDX_02._M_head_impl;
      }
      puVar13 = local_d0;
      if (local_d8 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)local_158);
        pcVar19 = "";
        if (local_d0 != (undefined8 *)0x0) {
          pcVar19 = (char *)*local_d0;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x4a9,pcVar19);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
        iVar7 = extraout_EDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_158._0_8_ + 8))();
          iVar7 = extraout_EDX_00;
        }
        puVar13 = local_d0;
        if (local_d0 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_d0 != local_d0 + 2) {
            operator_delete((undefined8 *)*local_d0);
          }
          operator_delete(puVar13);
          iVar7 = extraout_EDX_01;
        }
        iVar17 = 1;
        goto LAB_0011fe2e;
      }
      if (local_d0 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_d0 != local_d0 + 2) {
          operator_delete((undefined8 *)*local_d0);
        }
        operator_delete(puVar13);
        _Var14._M_head_impl = extraout_RDX_03;
      }
      iVar7 = (int)_Var14._M_head_impl;
      bVar23 = 0x4e < (uint)plVar22;
      uVar8 = (uint)plVar22 + 1;
      plVar22 = (leveldb *)(ulong)uVar8;
    } while (uVar8 != 0x50);
    iVar17 = 4;
LAB_0011fe2e:
    if (bVar23) {
      Key_abi_cxx11_(&local_138,(leveldb *)0x32,iVar7);
      local_158._0_8_ = "";
      local_158._8_8_ = (undefined8 *)0x0;
      local_148._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
      local_148._8_8_ = local_138._M_string_length;
      pDVar2 = (this->super_DBTest).db_;
      (*pDVar2->_vptr_DB[10])(pDVar2,(string *)local_158,1,&local_118);
      pcVar19 = local_118.data_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.data_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_118.data_,0,0);
      }
      local_100._M_dataplus._M_p._0_1_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar19 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_100._M_string_length = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      sVar6 = local_100._M_string_length;
      if ((char)local_100._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_158,(internal *)&local_100,
                   (AssertionResult *)"Between(Size(\"\", Key(50)), 0, 0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x4ad,(char *)local_158._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_118,(Message *)&local_138)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ != &local_148) {
          operator_delete((void *)local_158._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
        }
        sVar6 = local_100._M_string_length;
        if ((undefined8 *)local_100._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_100._M_string_length !=
              (undefined8 *)(local_100._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_100._M_string_length);
          }
          operator_delete((void *)sVar6);
        }
        iVar17 = 1;
      }
      else {
        if ((undefined8 *)local_100._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_100._M_string_length !=
              (undefined8 *)(local_100._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_100._M_string_length);
          }
          operator_delete((void *)sVar6);
        }
        if (local_90.reuse_logs == false) {
          iVar7 = 0;
          do {
            local_dc = iVar7;
            DBTest::Reopen(&this->super_DBTest,&local_90);
            uVar9 = 0;
            lVar16 = extraout_RDX_04;
            do {
              plVar22 = (leveldb *)0x0;
              plVar21 = (long *)0x0;
              plVar18 = (long *)0x0;
              uVar12 = 0;
              uVar20 = 0;
              local_b8 = uVar9;
              do {
                local_c8 = uVar12;
                Key_abi_cxx11_(&local_138,plVar22,(int)lVar16);
                local_158._0_8_ = "";
                local_158._8_8_ = (undefined8 *)0x0;
                local_148._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
                local_148._8_8_ = local_138._M_string_length;
                pDVar2 = (this->super_DBTest).db_;
                (*pDVar2->_vptr_DB[10])(pDVar2,local_158,1,&local_118);
                bVar24 = plVar21 <= local_118.data_;
                bVar23 = local_118.data_ <= plVar18;
                paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118.data_;
                if (!bVar23 || !bVar24) {
                  fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_118.data_,
                          plVar21,plVar18);
                  paVar11 = extraout_RDX_08;
                }
                iVar7 = (int)paVar11;
                local_100._M_dataplus._M_p._0_1_ = bVar23 && bVar24;
                local_100._M_string_length = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                  iVar7 = extraout_EDX_02;
                }
                sVar6 = local_100._M_string_length;
                if ((char)local_100._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_138);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_158,(internal *)&local_100,
                             (AssertionResult *)"Between(Size(\"\", Key(i)), S1 * i, S2 * i)",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_118,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                             ,0x4bd,(char *)local_158._0_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_118,(Message *)&local_138);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
                  iVar7 = extraout_EDX_07;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._0_8_ != &local_148) {
                    operator_delete((void *)local_158._0_8_);
                    iVar7 = extraout_EDX_08;
                  }
                  puVar13 = (undefined8 *)local_100._M_string_length;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
                    puVar13 = (undefined8 *)local_100._M_string_length;
                    iVar7 = extraout_EDX_09;
                  }
LAB_001205b5:
                  if (puVar13 != (undefined8 *)0x0) {
                    if ((undefined8 *)*puVar13 != puVar13 + 2) {
                      operator_delete((undefined8 *)*puVar13);
                    }
                    operator_delete(puVar13);
                    iVar7 = extraout_EDX_13;
                  }
                  iVar17 = 1;
                  uVar12 = local_c8;
                  goto LAB_00120696;
                }
                if ((undefined8 *)local_100._M_string_length != (undefined8 *)0x0) {
                  if (*(undefined8 **)local_100._M_string_length !=
                      (undefined8 *)(local_100._M_string_length + 0x10)) {
                    operator_delete(*(undefined8 **)local_100._M_string_length);
                  }
                  operator_delete((void *)sVar6);
                  iVar7 = extraout_EDX_03;
                }
                Key_abi_cxx11_(&local_100,(leveldb *)(uVar20 & 0xffffffff),iVar7);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_100);
                puVar1 = (ulong *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar1) {
                  local_138.field_2._M_allocated_capacity = *puVar1;
                  local_138.field_2._8_4_ = (undefined4)plVar10[3];
                  local_138.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                }
                else {
                  local_138.field_2._M_allocated_capacity = *puVar1;
                  local_138._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_148._8_8_ = plVar10[1];
                *plVar10 = (long)puVar1;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                local_158._0_8_ = "";
                local_158._8_8_ = (undefined8 *)0x0;
                local_148._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
                pDVar2 = (this->super_DBTest).db_;
                local_138._M_string_length = local_148._8_8_;
                (*pDVar2->_vptr_DB[10])(pDVar2,local_158,1,&local_d8);
                plVar10 = (long *)CONCAT71(uStack_d7,local_d8);
                bVar24 = plVar21 + 0x30d4 <= plVar10;
                bVar23 = plVar10 <= plVar18 + 0x3345;
                if (!bVar23 || !bVar24) {
                  fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n");
                  plVar10 = extraout_RDX_09;
                }
                iVar7 = (int)plVar10;
                local_118.data_ = (char *)CONCAT71(local_118.data_._1_7_,bVar23 && bVar24);
                local_118.size_ = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                  iVar7 = extraout_EDX_04;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p);
                  iVar7 = extraout_EDX_05;
                }
                sVar4 = local_118.size_;
                if ((char)local_118.data_ == '\0') {
                  testing::Message::Message((Message *)&local_138);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_158,(internal *)&local_118,
                             (AssertionResult *)
                             "Between(Size(\"\", Key(i) + \".suffix\"), S1 * (i + 1), S2 * (i + 1))"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_100,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                             ,0x4bf,(char *)local_158._0_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_100,(Message *)&local_138);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
                  iVar7 = extraout_EDX_10;
                  puVar13 = (undefined8 *)local_118.size_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._0_8_ != &local_148) {
                    operator_delete((void *)local_158._0_8_);
                    iVar7 = extraout_EDX_11;
                    puVar13 = (undefined8 *)local_118.size_;
                  }
joined_r0x001205a8:
                  local_118.size_ = (size_t)puVar13;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
                    puVar13 = (undefined8 *)local_118.size_;
                    iVar7 = extraout_EDX_12;
                  }
                  goto LAB_001205b5;
                }
                if ((undefined8 *)local_118.size_ != (undefined8 *)0x0) {
                  if (*(undefined8 **)local_118.size_ != (undefined8 *)(local_118.size_ + 0x10)) {
                    operator_delete(*(undefined8 **)local_118.size_);
                  }
                  operator_delete((void *)sVar4);
                  iVar7 = extraout_EDX_06;
                }
                Key_abi_cxx11_(&local_138,(leveldb *)(uVar20 & 0xffffffff),iVar7);
                local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_138._M_dataplus._M_p;
                puStack_a0 = (undefined8 *)local_138._M_string_length;
                Key_abi_cxx11_(&local_100,(leveldb *)(uVar20 + 10 & 0xffffffff),i_00);
                local_158._0_8_ = local_a8;
                local_158._8_8_ = puStack_a0;
                local_148._M_allocated_capacity = (size_type)local_100._M_dataplus._M_p;
                local_148._8_8_ = local_100._M_string_length;
                pDVar2 = (this->super_DBTest).db_;
                (*pDVar2->_vptr_DB[10])(pDVar2,local_158,1,&local_d8);
                lVar16 = CONCAT71(uStack_d7,local_d8);
                uVar9 = lVar16 - 1000000;
                if (50000 < uVar9) {
                  fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",lVar16,1000000,
                          0x100590);
                  lVar16 = extraout_RDX_10;
                }
                local_118.data_ = (char *)CONCAT71(local_118.data_._1_7_,uVar9 < 0xc351);
                local_118.size_ = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p);
                  lVar16 = extraout_RDX_05;
                }
                paVar11 = &local_138.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != paVar11) {
                  operator_delete(local_138._M_dataplus._M_p);
                  paVar11 = extraout_RAX;
                  lVar16 = extraout_RDX_06;
                }
                sVar4 = local_118.size_;
                if ((char)local_118.data_ == '\0') {
                  testing::Message::Message((Message *)&local_138);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_158,(internal *)&local_118,
                             (AssertionResult *)
                             "Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10)","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_100,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                             ,0x4c0,(char *)local_158._0_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_100,(Message *)&local_138);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
                  iVar7 = extraout_EDX_14;
                  puVar13 = (undefined8 *)local_118.size_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._0_8_ != &local_148) {
                    operator_delete((void *)local_158._0_8_);
                    iVar7 = extraout_EDX_15;
                    puVar13 = (undefined8 *)local_118.size_;
                  }
                  goto joined_r0x001205a8;
                }
                if ((undefined8 *)local_118.size_ != (undefined8 *)0x0) {
                  if (*(undefined8 **)local_118.size_ != (undefined8 *)(local_118.size_ + 0x10)) {
                    operator_delete(*(undefined8 **)local_118.size_);
                  }
                  operator_delete((void *)sVar4);
                  paVar11 = extraout_RAX_00;
                  lVar16 = extraout_RDX_07;
                }
                iVar7 = (int)lVar16;
                plVar18 = plVar18 + 0x200b2;
                plVar21 = plVar21 + 0x1e848;
                plVar22 = (leveldb *)(ulong)((int)plVar22 + 10);
                bVar23 = uVar20 < 0x46;
                uVar12 = CONCAT71((int7)((ulong)paVar11 >> 8),!bVar23);
                uVar20 = uVar20 + 10;
              } while (bVar23);
              iVar17 = 0xd;
LAB_00120696:
              paVar11 = &local_138.field_2;
              if ((uVar12 & 1) == 0) goto LAB_00120a90;
              Key_abi_cxx11_(&local_138,(leveldb *)0x32,iVar7);
              local_158._0_8_ = "";
              local_158._8_8_ = (undefined8 *)0x0;
              local_148._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
              local_148._8_8_ = local_138._M_string_length;
              pDVar2 = (this->super_DBTest).db_;
              (*pDVar2->_vptr_DB[10])(pDVar2,(string *)local_158,1,&local_118);
              plVar18 = (long *)((long)local_118.data_ + -5000000);
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118.data_;
              if ((long *)0x3d090 < plVar18) {
                fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_118.data_,5000000,
                        0x501bd0);
                paVar15 = extraout_RDX_14;
              }
              iVar7 = (int)paVar15;
              local_100._M_dataplus._M_p._0_1_ = plVar18 < (long *)0x3d091;
              local_100._M_string_length = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != paVar11) {
                operator_delete(local_138._M_dataplus._M_p);
                iVar7 = extraout_EDX_16;
              }
              sVar6 = local_100._M_string_length;
              if ((char)local_100._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_158,(internal *)&local_100,
                           (AssertionResult *)"Between(Size(\"\", Key(50)), S1 * 50, S2 * 50)",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_118,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                           ,0x4c2,(char *)local_158._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_118,(Message *)&local_138);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._0_8_ != &local_148) {
                  operator_delete((void *)local_158._0_8_);
                }
                puVar13 = (undefined8 *)local_100._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
                  puVar13 = (undefined8 *)local_100._M_string_length;
                }
LAB_00120a55:
                if (puVar13 != (undefined8 *)0x0) {
                  if ((undefined8 *)*puVar13 != puVar13 + 2) {
                    operator_delete((undefined8 *)*puVar13);
                  }
                  operator_delete(puVar13);
                }
                iVar17 = 1;
                goto LAB_00120a90;
              }
              if ((undefined8 *)local_100._M_string_length != (undefined8 *)0x0) {
                if (*(undefined8 **)local_100._M_string_length !=
                    (undefined8 *)(local_100._M_string_length + 0x10)) {
                  operator_delete(*(undefined8 **)local_100._M_string_length);
                }
                operator_delete((void *)sVar6);
                iVar7 = extraout_EDX_17;
              }
              Key_abi_cxx11_(&local_100,(leveldb *)0x32,iVar7);
              puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
              puVar1 = puVar13 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar1) {
                local_138.field_2._M_allocated_capacity = *puVar1;
                local_138.field_2._8_4_ = *(undefined4 *)(puVar13 + 3);
                local_138.field_2._12_4_ = *(undefined4 *)((long)puVar13 + 0x1c);
                local_138._M_dataplus._M_p = (pointer)paVar11;
              }
              else {
                local_138.field_2._M_allocated_capacity = *puVar1;
                local_138._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_148._8_8_ = puVar13[1];
              *puVar13 = puVar1;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              local_158._0_8_ = "";
              local_158._8_8_ = (undefined8 *)0x0;
              local_148._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
              pDVar2 = (this->super_DBTest).db_;
              local_138._M_string_length = local_148._8_8_;
              (*pDVar2->_vptr_DB[10])(pDVar2,(string *)local_158,1,&local_d8);
              lVar16 = CONCAT71(uStack_d7,local_d8);
              uVar9 = lVar16 - 5000000;
              if (250000 < uVar9) {
                fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",lVar16,5000000,0x501bd0)
                ;
                lVar16 = extraout_RDX_15;
              }
              iVar7 = (int)lVar16;
              local_118.data_ = (char *)CONCAT71(local_118.data_._1_7_,uVar9 < 0x3d091);
              local_118.size_ = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != paVar11) {
                operator_delete(local_138._M_dataplus._M_p);
                iVar7 = extraout_EDX_18;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p);
                iVar7 = extraout_EDX_19;
              }
              sVar4 = local_118.size_;
              if ((char)local_118.data_ == '\0') {
                testing::Message::Message((Message *)&local_138);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_158,(internal *)&local_118,
                           (AssertionResult *)
                           "Between(Size(\"\", Key(50) + \".suffix\"), S1 * 50, S2 * 50)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_100,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                           ,0x4c3,(char *)local_158._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_100,(Message *)&local_138);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._0_8_ != &local_148) {
                  operator_delete((void *)local_158._0_8_);
                }
                puVar13 = (undefined8 *)local_118.size_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
                  puVar13 = (undefined8 *)local_118.size_;
                }
                goto LAB_00120a55;
              }
              if ((undefined8 *)local_118.size_ != (undefined8 *)0x0) {
                if (*(undefined8 **)local_118.size_ != (undefined8 *)(local_118.size_ + 0x10)) {
                  operator_delete(*(undefined8 **)local_118.size_);
                }
                operator_delete((void *)sVar4);
                iVar7 = extraout_EDX_20;
              }
              uVar8 = (uint)local_b8;
              Key_abi_cxx11_((string *)local_158,(leveldb *)(local_b8 & 0xffffffff),iVar7);
              Key_abi_cxx11_(&local_138,(leveldb *)(ulong)(uVar8 + 9),i_01);
              local_100._M_dataplus._M_p = (pointer)local_158._0_8_;
              local_100._M_string_length = local_158._8_8_;
              local_118.data_ = local_138._M_dataplus._M_p;
              local_118.size_ = local_138._M_string_length;
              DBImpl::TEST_CompactRange
                        ((DBImpl *)(this->super_DBTest).db_,0,(Slice *)&local_100,&local_118);
              lVar16 = extraout_RDX_11;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != paVar11) {
                operator_delete(local_138._M_dataplus._M_p);
                lVar16 = extraout_RDX_12;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._0_8_ != &local_148) {
                operator_delete((void *)local_158._0_8_);
                lVar16 = extraout_RDX_13;
              }
              uVar9 = (ulong)(uVar8 + 10);
            } while (uVar8 < 0x46);
            iVar17 = 10;
LAB_00120a90:
            if (iVar17 != 10) goto LAB_00120c4f;
            iVar7 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
            local_138._M_dataplus._M_p._0_4_ = iVar7;
            local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_158,"NumTableFilesAtLevel(0)","0",(int *)&local_138,
                       (int *)&local_100);
            uVar3 = local_158._8_8_;
            if (local_158[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_138);
              pcVar19 = "";
              if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
                pcVar19 = *(char **)local_158._8_8_;
              }
              iVar7 = 0x4cc;
LAB_00120bf8:
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_100,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,iVar7,pcVar19);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_100,(Message *)&local_138);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
              }
              uVar3 = local_158._8_8_;
              if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
                if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
                  operator_delete(*(undefined8 **)local_158._8_8_);
                }
                operator_delete((void *)uVar3);
              }
              iVar17 = 1;
              goto LAB_00120c4f;
            }
            if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
              if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
                operator_delete(*(undefined8 **)local_158._8_8_);
              }
              operator_delete((void *)uVar3);
            }
            iVar7 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
            local_138._M_dataplus._M_p._0_4_ = iVar7;
            local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffff00000000;
            testing::internal::CmpHelperGT<int,int>
                      ((internal *)local_158,"NumTableFilesAtLevel(1)","0",(int *)&local_138,
                       (int *)&local_100);
            uVar3 = local_158._8_8_;
            if (local_158[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_138);
              pcVar19 = "";
              if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
                pcVar19 = *(char **)local_158._8_8_;
              }
              iVar7 = 0x4cd;
              goto LAB_00120bf8;
            }
            if ((undefined8 *)local_158._8_8_ != (undefined8 *)0x0) {
              if (*(undefined8 **)local_158._8_8_ != (undefined8 *)(local_158._8_8_ + 0x10)) {
                operator_delete(*(undefined8 **)local_158._8_8_);
              }
              operator_delete((void *)uVar3);
            }
            iVar7 = local_dc + 1;
          } while (iVar7 != 3);
          iVar17 = 7;
LAB_00120c4f:
          if (iVar17 == 7) {
            iVar17 = 0;
          }
        }
        else {
          DBTest::Reopen(&this->super_DBTest,&local_90);
          Key_abi_cxx11_(&local_138,(leveldb *)0x32,i);
          local_158._0_8_ = "";
          local_158._8_8_ = (undefined8 *)0x0;
          local_148._M_allocated_capacity = (size_type)local_138._M_dataplus._M_p;
          local_148._8_8_ = local_138._M_string_length;
          pDVar2 = (this->super_DBTest).db_;
          (*pDVar2->_vptr_DB[10])(pDVar2,(string *)local_158,1,&local_100);
          _Var5._M_p = local_100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            fprintf(_stderr,"Value %llu is not in range [%llu, %llu]\n",local_100._M_dataplus._M_p,0
                    ,0);
          }
          local_100._M_dataplus._M_p._0_1_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var5._M_p ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_100._M_string_length = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          iVar17 = 3;
          if ((char)local_100._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_138);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_158,(internal *)&local_100,
                       (AssertionResult *)"Between(Size(\"\", Key(50)), 0, 0)","false","true",in_R9)
            ;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_118,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x4b3,(char *)local_158._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_118,(Message *)&local_138);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._0_8_ != &local_148) {
              operator_delete((void *)local_158._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
            }
            iVar17 = 1;
          }
          sVar6 = local_100._M_string_length;
          if ((undefined8 *)local_100._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_100._M_string_length !=
                (undefined8 *)(local_100._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_100._M_string_length);
            }
            operator_delete((void *)sVar6);
          }
        }
      }
    }
    if (iVar17 == 1) {
      return;
    }
    iVar7 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar7 + 1;
    if (2 < iVar7) {
      return;
    }
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  } while( true );
}

Assistant:

TEST_F(DBTest, ApproximateSizes) {
  do {
    Options options = CurrentOptions();
    options.write_buffer_size = 100000000;  // Large write buffer
    options.compression = kNoCompression;
    DestroyAndReopen();

    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));
    Reopen(&options);
    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));

    // Write 8MB (80 values, each 100K)
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
    const int N = 80;
    static const int S1 = 100000;
    static const int S2 = 105000;  // Allow some expansion from metadata
    Random rnd(301);
    for (int i = 0; i < N; i++) {
      ASSERT_LEVELDB_OK(Put(Key(i), RandomString(&rnd, S1)));
    }

    // 0 because GetApproximateSizes() does not account for memtable space
    ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));

    if (options.reuse_logs) {
      // Recovery will reuse memtable, and GetApproximateSizes() does not
      // account for memtable usage;
      Reopen(&options);
      ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));
      continue;
    }

    // Check sizes across recovery by reopening a few times
    for (int run = 0; run < 3; run++) {
      Reopen(&options);

      for (int compact_start = 0; compact_start < N; compact_start += 10) {
        for (int i = 0; i < N; i += 10) {
          ASSERT_TRUE(Between(Size("", Key(i)), S1 * i, S2 * i));
          ASSERT_TRUE(Between(Size("", Key(i) + ".suffix"), S1 * (i + 1),
                              S2 * (i + 1)));
          ASSERT_TRUE(Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10));
        }
        ASSERT_TRUE(Between(Size("", Key(50)), S1 * 50, S2 * 50));
        ASSERT_TRUE(Between(Size("", Key(50) + ".suffix"), S1 * 50, S2 * 50));

        std::string cstart_str = Key(compact_start);
        std::string cend_str = Key(compact_start + 9);
        Slice cstart = cstart_str;
        Slice cend = cend_str;
        dbfull()->TEST_CompactRange(0, &cstart, &cend);
      }

      ASSERT_EQ(NumTableFilesAtLevel(0), 0);
      ASSERT_GT(NumTableFilesAtLevel(1), 0);
    }
  } while (ChangeOptions());
}